

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,part *part,part *def)

{
  bool bVar1;
  int iVar2;
  FSerializer *pFVar3;
  
  bVar1 = FSerializer::canSkip(arc);
  if ((def != (part *)0x0 && bVar1) && (iVar2 = bcmp(part,def,0x30), iVar2 == 0)) {
    return arc;
  }
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    pFVar3 = FSerializer::operator()(arc,"xoffset",&part->xOffset,&def->xOffset);
    pFVar3 = FSerializer::operator()(pFVar3,"yoffset",&part->yOffset,&def->yOffset);
    pFVar3 = FSerializer::operator()(pFVar3,"xscale",&part->xScale,&def->xScale);
    pFVar3 = FSerializer::operator()(pFVar3,"yscale",&part->yScale,&def->yScale);
    pFVar3 = FSerializer::operator()(pFVar3,"texture",&part->texture,&def->texture);
    pFVar3 = FSerializer::operator()(pFVar3,"interpolation",&part->interpolation);
    FSerializer::EndObject(pFVar3);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, side_t::part &part, side_t::part *def)
{
	if (arc.canSkip() && def != nullptr && !memcmp(&part, def, sizeof(part)))
	{
		return arc;
	}

	if (arc.BeginObject(key))
	{
		arc("xoffset", part.xOffset, def->xOffset)
			("yoffset", part.yOffset, def->yOffset)
			("xscale", part.xScale, def->xScale)
			("yscale", part.yScale, def->yScale)
			("texture", part.texture, def->texture)
			("interpolation", part.interpolation)
			.EndObject();
	}
	return arc;
}